

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_script.cpp
# Opt level: O2

void __thiscall DRunningScript::Destroy(DRunningScript *this)

{
  DFsVariable *pDVar1;
  DFsVariable *pDVar2;
  long lVar3;
  
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
    pDVar1 = GC::ReadBarrier<DFsVariable>(&this->variables[lVar3].field_0.p);
    while (pDVar1 != (DFsVariable *)0x0) {
      pDVar2 = GC::ReadBarrier<DFsVariable>((DFsVariable **)&pDVar1->next);
      (*(pDVar1->super_DObject)._vptr_DObject[4])(pDVar1);
      pDVar1 = pDVar2;
    }
    this->variables[lVar3].field_0.p = (DFsVariable *)0x0;
  }
  DObject::Destroy(&this->super_DObject);
  return;
}

Assistant:

void DRunningScript::Destroy()
{
	int i;
	DFsVariable *current, *next;
	
	for(i=0; i<VARIABLESLOTS; i++)
    {
		current = variables[i];
		
		// go thru this chain
		while(current)
		{
			next = current->next; // save for after freeing
			current->Destroy();
			current = next; // go to next in chain
		}
		variables[i] = NULL;
    }
	Super::Destroy();
}